

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
vkt::shaderexecutor::Functions::OuterProduct<3,_3>::doApply
          (IRet *__return_storage_ptr__,OuterProduct<3,_3> *this,EvalContext *ctx,IArgs *iargs)

{
  long lVar1;
  long lVar2;
  IArg3 local_62;
  IArg2 local_61;
  IRet *local_60;
  Vector<tcu::Interval,_3> *local_58;
  long local_50;
  IRet local_48;
  
  tcu::Matrix<tcu::Interval,_3,_3>::Matrix(__return_storage_ptr__);
  lVar1 = 0;
  local_60 = __return_storage_ptr__;
  while (lVar1 != 3) {
    local_58 = (Vector<tcu::Interval,_3> *)__return_storage_ptr__;
    local_50 = lVar1;
    for (lVar2 = 0; lVar2 != 0x48; lVar2 = lVar2 + 0x18) {
      call<vkt::shaderexecutor::Functions::Mul>
                (&local_48,ctx,iargs->a->m_data + lVar1,
                 (IArg1 *)(&iargs->b->m_data[0].m_hasNaN + lVar2),&local_61,&local_62);
      ((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)
      ((Vector<tcu::Interval,_3> *)__return_storage_ptr__)->m_data)->m_data[0].m_data[0].m_hi =
           local_48.m_hi;
      ((Vector<tcu::Interval,_3> *)__return_storage_ptr__)->m_data[0].m_hasNaN = local_48.m_hasNaN;
      *(undefined7 *)&((Vector<tcu::Interval,_3> *)__return_storage_ptr__)->m_data[0].field_0x1 =
           local_48._1_7_;
      ((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)
      ((Vector<tcu::Interval,_3> *)__return_storage_ptr__)->m_data)->m_data[0].m_data[0].m_lo =
           local_48.m_lo;
      __return_storage_ptr__ = (IRet *)((long)__return_storage_ptr__ + 0x48);
    }
    __return_storage_ptr__ = (IRet *)(local_58->m_data + 1);
    lVar1 = local_50 + 1;
  }
  return local_60;
}

Assistant:

IRet	doApply	(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet	ret;

		for (int row = 0; row < Rows; ++row)
		{
			for (int col = 0; col < Cols; ++col)
				ret[col][row] = call<Mul>(ctx, iargs.a[row], iargs.b[col]);
		}

		return ret;
	}